

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

BOOL QueryThreadCycleTime(HANDLE ThreadHandle,PULONG64 CycleTime)

{
  BOOL BVar1;
  _FILETIME local_28;
  FILETIME kernelTime;
  FILETIME userTime;
  
  BVar1 = CorUnix::GetThreadTimesInternal(ThreadHandle,&local_28,&kernelTime);
  if (BVar1 == 0) {
    fprintf(_stderr,"] %s %s:%d","QueryThreadCycleTime",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/time.cpp"
            ,0x12e);
    fprintf(_stderr,"Could not get cycle time for current thread");
  }
  else {
    *CycleTime = (ulong)kernelTime.dwLowDateTime +
                 ((ulong)kernelTime.dwHighDateTime << 0x20) + (long)local_28;
  }
  return (uint)(BVar1 != 0);
}

Assistant:

BOOL
PALAPI
QueryThreadCycleTime(
    IN HANDLE ThreadHandle,
    OUT PULONG64 CycleTime
    )
{

    ULONG64 calcTime;
    FILETIME kernelTime, userTime;
    BOOL retval = TRUE;

    if(!GetThreadTimesInternal(ThreadHandle, &kernelTime, &userTime))
    {
        ASSERT("Could not get cycle time for current thread");
        retval = FALSE;
        goto EXIT;
    }

    calcTime = ((ULONG64)kernelTime.dwHighDateTime << 32);
    calcTime += (ULONG64)kernelTime.dwLowDateTime;
    calcTime += ((ULONG64)userTime.dwHighDateTime << 32);
    calcTime += (ULONG64)userTime.dwLowDateTime;
    *CycleTime = calcTime;

EXIT:
    return retval;
}